

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TangentFixedRadiusArc.cpp
# Opt level: O3

int GeoCalcs::TangentFixedRadiusArc
              (LLPoint *pt1,double crs12,LLPoint *pt3,double crs3,double radius,int *dir,
              LLPoint *centerPt,LLPoint *tanPt1,LLPoint *tanPt2,double dTol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  LLPoint LVar7;
  InverseResult result;
  LLPoint pt2;
  double dDistFromPt;
  double dCrsFromPt;
  double local_108;
  LLPoint local_c8;
  LLPoint local_b8;
  InverseResult local_a8;
  LLPoint local_88;
  double local_70;
  LLPoint *local_68;
  LLPoint *local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_88.latitude = 0.0;
  local_88.longitude = 0.0;
  local_50 = crs3 + 3.141592653589793;
  local_58 = crs3;
  local_48 = crs12;
  bVar5 = CrsIntersect(pt1,crs12,pt3,local_50,dTol,&local_88);
  uVar6 = 0;
  if (bVar5) {
    local_a8.azimuth = 0.0;
    local_a8.reverseAzimuth = 0.0;
    local_a8.distance = 0.0;
    local_60 = tanPt1;
    DistVincenty(pt1,&local_88,&local_a8);
    local_108 = local_a8.distance;
    DistVincenty(&local_88,pt1,&local_a8);
    dVar1 = local_a8.azimuth;
    DistVincenty(&local_88,pt3,&local_a8);
    dVar1 = SignAzimuthDifference(dVar1,local_a8.azimuth);
    dVar2 = sin(dVar1);
    uVar6 = 0;
    if (dTol <= ABS(dVar2)) {
      *dir = (uint)(dVar1 <= 0.0) * 2 + -1;
      dVar2 = kSphereRadius;
      if (radius <= ABS(dVar1 * kSphereRadius * 0.5)) {
        local_68 = tanPt2;
        local_70 = tan(radius / kSphereRadius);
        dVar3 = tan(dVar1 * 0.5);
        dVar3 = asin(local_70 / dVar3);
        dVar4 = 0.0;
        local_108 = local_108 - ABS(dVar3 * dVar2);
        local_b8.latitude = 0.0;
        local_b8.longitude = 0.0;
        local_c8.latitude = 0.0;
        local_c8.longitude = 0.0;
        for (uVar6 = 0; (uVar6 == 0 || ((dTol < ABS(dVar4) && (uVar6 < 0xb)))); uVar6 = uVar6 + 1) {
          dVar2 = sin(dVar1);
          local_108 = local_108 - dVar4 / ABS(dVar2);
          LVar7 = DestVincenty(pt1,local_48,local_108);
          local_b8.longitude = LVar7.longitude;
          local_b8.latitude = LVar7.latitude;
          DistVincenty(&local_b8,&local_88,&local_a8);
          local_a8.azimuth =
               local_a8.azimuth + *(double *)(&DAT_001602b0 + (ulong)((uint)*dir >> 0x1f) * 8);
          LVar7 = DestVincenty(&local_b8,local_a8.azimuth,radius);
          centerPt->latitude = LVar7.latitude;
          centerPt->longitude = LVar7.longitude;
          LVar7 = PerpIntercept(pt3,local_50,centerPt,&local_38,&local_40,dTol);
          local_c8.longitude = LVar7.longitude;
          local_c8.latitude = LVar7.latitude;
          DistVincenty(centerPt,&local_c8,&local_a8);
          dVar4 = radius - local_a8.distance;
        }
        local_60->latitude = local_b8.latitude;
        local_60->longitude = local_b8.longitude;
        local_68->latitude = local_c8.latitude;
        local_68->longitude = local_c8.longitude;
        DistVincenty(&local_88,local_68,&local_a8);
        dVar1 = SignAzimuthDifference(local_a8.azimuth,local_58);
        uVar6 = (uint)(ABS(dVar1) <= 1.5707963267948966);
      }
    }
  }
  return uVar6;
}

Assistant:

int TangentFixedRadiusArc(const LLPoint &pt1, double crs12, const LLPoint &pt3,
                              double crs3, double radius, int &dir,
                              LLPoint &centerPt, LLPoint &tanPt1, LLPoint &tanPt2, double dTol)
    {
        LLPoint pt2;
        if (!CrsIntersect(pt1, crs12, pt3, crs3 + M_PI, dTol, pt2))
            return 0;

        InverseResult result;
        DistVincenty(pt1, pt2, result);
        const double dist12 = result.distance;

        DistVincenty(pt2, pt1, result);
        const double crs21 = result.azimuth;

        DistVincenty(pt2, pt3, result);
        const double vertexAngle = SignAzimuthDifference(crs21, result.azimuth);

        if (fabs(sin(vertexAngle)) < dTol)
            return 0;

        dir = vertexAngle > 0.0 ? -1 : 1;

        if (radius > fabs(kSphereRadius * vertexAngle / 2.0))
            return 0;

        double distToStart = dist12 - fabs(kSphereRadius *
                                           asin(tan(radius / kSphereRadius) / tan(vertexAngle / 2.0)));
        LLPoint startPt, endPt;
        int k = 0;
        double dErr = 0.0;
        while (k == 0 || (fabs(dErr) > dTol && k <= 10))
        {
            distToStart = distToStart - dErr / fabs(sin(vertexAngle));
            startPt = DestVincenty(pt1, crs12, distToStart);
            DistVincenty(startPt, pt2, result);
            result.azimuth += dir < 0 ? M_PI_2 : -M_PI_2;
            centerPt = DestVincenty(startPt, result.azimuth, radius);

            double dCrsFromPt, dDistFromPt;
            endPt = PerpIntercept(pt3, crs3 + M_PI, centerPt, dCrsFromPt, dDistFromPt, dTol);
            DistVincenty(centerPt, endPt, result);
            dErr = radius - result.distance;
            k++;
        }
        tanPt1 = startPt;
        tanPt2 = endPt;

        DistVincenty(pt2, tanPt2, result);

        return fabs(SignAzimuthDifference(result.azimuth, crs3)) <= M_PI_2;
    }